

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-get-passwd.c
# Opt level: O2

int run_test_get_group(void)

{
  int iVar1;
  char *pcVar2;
  undefined8 uVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  int64_t eval_b;
  int64_t eval_b_1;
  uv_group_t grp;
  uv_passwd_t pwd;
  
  iVar1 = uv_os_get_passwd(&pwd);
  pcVar2 = (char *)(long)iVar1;
  grp.groupname = pcVar2;
  if (pcVar2 == (char *)0x0) {
    iVar1 = uv_os_get_group(&grp,(undefined4)pwd.gid);
    pcVar2 = (char *)(long)iVar1;
    eval_b_1 = 0;
    if (pcVar2 == (char *)0x0) {
      pcVar2 = (char *)CONCAT44(pwd.gid._4_4_,(undefined4)pwd.gid);
      if (pcVar2 == (char *)grp.gid) {
        pcVar2 = (char *)strlen(grp.groupname);
        eval_b_1 = 0;
        if ((long)pcVar2 < 1) {
          pcVar5 = ">";
          pcVar6 = "0";
          pcVar4 = "len";
          uVar3 = 0xc5;
        }
        else {
          uv_os_free_group(&grp);
          uv_os_free_passwd(&pwd);
          iVar1 = uv_os_get_group(0,(undefined4)pwd.gid);
          pcVar2 = (char *)(long)iVar1;
          eval_b_1 = -0x16;
          if (pcVar2 == (char *)0xffffffffffffffea) {
            return 0;
          }
          pcVar5 = "==";
          pcVar6 = "UV_EINVAL";
          pcVar4 = "r";
          uVar3 = 0xd1;
        }
      }
      else {
        pcVar5 = "==";
        pcVar6 = "grp.gid";
        pcVar4 = "pwd.gid";
        uVar3 = 0xc2;
        eval_b_1 = grp.gid;
      }
    }
    else {
      pcVar5 = "==";
      pcVar6 = "0";
      pcVar4 = "r";
      uVar3 = 0xc1;
    }
  }
  else {
    pcVar6 = "0";
    pcVar4 = "r";
    uVar3 = 0xb8;
    eval_b_1 = 0;
    pcVar5 = "==";
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-get-passwd.c"
          ,uVar3,pcVar4,pcVar5,pcVar6,pcVar2,pcVar5,eval_b_1);
  abort();
}

Assistant:

TEST_IMPL(get_group) {
/* TODO(gengjiawen): Fix test on QEMU. */
#if defined(__QEMU__)
  RETURN_SKIP("Test does not currently work in QEMU");
#endif

  uv_passwd_t pwd;
  uv_group_t grp;
  size_t len;
  int r;

  r = uv_os_get_passwd(&pwd);
  ASSERT_OK(r);

  r = uv_os_get_group(&grp, pwd.gid);

#ifdef _WIN32
  ASSERT_EQ(r, UV_ENOTSUP);
  (void) &len;

#else
  ASSERT_OK(r);
  ASSERT_EQ(pwd.gid, grp.gid);

  len = strlen(grp.groupname);
  ASSERT_GT(len, 0);

  uv_os_free_group(&grp);
#endif

  uv_os_free_passwd(&pwd);

  /* Test invalid input */
  r = uv_os_get_group(NULL, pwd.gid);
#ifdef _WIN32
  ASSERT_EQ(r, UV_ENOTSUP);
#else
  ASSERT_EQ(r, UV_EINVAL);
#endif

  return 0;
}